

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::GenerateFastInlineRegExpExec(Lowerer *this,Instr *instr)

{
  LowererMD *this_00;
  undefined2 valueType;
  Opnd *dst;
  Opnd *this_01;
  _func_int **pp_Var1;
  Instr *argoutInlineSpecialized;
  ScriptContextInfo *pSVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  int iVar6;
  uint sourceContextId;
  uint functionId;
  BailOutKind BVar7;
  undefined4 *puVar8;
  LabelInstr *labelHelper;
  RegOpnd *pRVar9;
  undefined4 extraout_var;
  AddrOpnd *pAVar10;
  Lowerer *pLVar11;
  IndirOpnd *pIVar12;
  LabelInstr *target;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  RegOpnd *pRVar13;
  Lowerer *pLVar14;
  LabelInstr *target_00;
  IntConstOpnd *pIVar15;
  LabelInstr *target_01;
  LabelInstr *target_02;
  HelperCallOpnd *src1Opnd;
  Instr *pIVar16;
  RegOpnd *dst_00;
  undefined4 extraout_var_00;
  BailOutInfo *bailoutInfo;
  Lowerer *pLVar17;
  JnHelperMethod helperMethod;
  Opnd *local_88;
  Opnd *argsOpnd [2];
  AutoReuseOpnd autoReuseStackAllocationOpnd;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x50a8,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar4) goto LAB_005a8e93;
    *puVar8 = 0;
  }
  dst = instr->m_dst;
  this_01 = instr->m_src2;
  OVar5 = IR::Opnd::GetKind(this_01);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_005a8e93;
    *puVar8 = 0;
  }
  pp_Var1 = this_01[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar4) goto LAB_005a8e93;
    *puVar8 = 0;
  }
  argoutInlineSpecialized = (Instr *)pp_Var1[5];
  bVar4 = IR::Instr::FetchOperands(instr,&local_88,2);
  if (bVar4) {
    argsOpnd[1] = (Opnd *)CONCAT62(argsOpnd[1]._2_6_,(argsOpnd[0]->m_valueType).field_0.bits);
    bVar4 = ValueType::IsLikelyString((ValueType *)(argsOpnd + 1));
    if (!bVar4) {
      return;
    }
    bVar4 = IR::Opnd::IsTaggedInt(local_88);
    if (bVar4) {
      return;
    }
    labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
    pLVar11 = (Lowerer *)(argsOpnd + 1);
    argsOpnd[1] = (Opnd *)CONCAT62(argsOpnd[1]._2_6_,(argsOpnd[0]->m_valueType).field_0.bits);
    bVar4 = ValueType::IsString((ValueType *)pLVar11);
    pRVar9 = (RegOpnd *)argsOpnd[0];
    if (!bVar4) {
      pRVar9 = GetRegOpnd(pLVar11,argsOpnd[0],instr,this->m_func,TyVar);
      OVar5 = IR::Opnd::GetKind(&pRVar9->super_Opnd);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005a8e93;
        *puVar8 = 0;
      }
      GenerateStringTest(this,pRVar9,instr,labelHelper,(LabelInstr *)0x0,true);
    }
    bVar4 = IR::Opnd::IsNotTaggedValue(local_88);
    if (!bVar4) {
      LowererMD::GenerateObjectTest(&this->m_lowererMD,local_88,instr,labelHelper,false);
    }
    pSVar2 = instr->m_func->m_scriptContextInfo;
    iVar6 = (*pSVar2->_vptr_ScriptContextInfo[0x21])(pSVar2,0x23);
    pLVar11 = (Lowerer *)CONCAT44(extraout_var,iVar6);
    pAVar10 = IR::AddrOpnd::New(pLVar11,AddrOpndKindDynamicVtable,this->m_func,false,(Var)0x0);
    pLVar11 = (Lowerer *)GetRegOpnd(pLVar11,local_88,instr,this->m_func,TyVar);
    OVar5 = IR::Opnd::GetKind((Opnd *)pLVar11);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_005a8e93;
      *puVar8 = 0;
    }
    pLVar14 = pLVar11;
    pIVar12 = IR::IndirOpnd::New((RegOpnd *)pLVar11,0,TyUint64,instr->m_func,false);
    InsertCompareBranch(pLVar14,&pIVar12->super_Opnd,&pAVar10->super_Opnd,BrNeq_A,false,labelHelper,
                        instr,false);
    target = IR::LabelInstr::New(Label,this->m_func,false);
    this_02 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_02);
    this_03 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,ExecBOIFastPathPhase,sourceContextId,functionId);
    if (!bVar4) {
      pRVar13 = IR::RegOpnd::New(TyUint64,this->m_func);
      OVar5 = IR::Opnd::GetKind((Opnd *)pLVar11);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005a8e93;
        *puVar8 = 0;
      }
      pIVar12 = IR::IndirOpnd::New((RegOpnd *)pLVar11,0x20,TyUint64,this->m_func,false);
      InsertMove(&pRVar13->super_Opnd,&pIVar12->super_Opnd,instr,true);
      pLVar14 = (Lowerer *)IR::RegOpnd::New(TyUint64,this->m_func);
      pIVar12 = IR::IndirOpnd::New(pRVar13,0x20,TyUint64,this->m_func,false);
      InsertMove((Opnd *)pLVar14,&pIVar12->super_Opnd,instr,true);
      target_00 = IR::LabelInstr::New(Label,this->m_func,false);
      pIVar12 = IR::IndirOpnd::New((RegOpnd *)pLVar14,0x15,TyUint8,this->m_func,false);
      pLVar17 = (Lowerer *)0x7;
      pIVar15 = IR::IntConstOpnd::New(7,TyUint8,this->m_func,false);
      InsertCompareBranch(pLVar17,&pIVar12->super_Opnd,&pIVar15->super_Opnd,BrNeq_A,false,target_00,
                          instr,false);
      pIVar12 = IR::IndirOpnd::New((RegOpnd *)pLVar14,0x14,TyUint8,this->m_func,false);
      pIVar15 = IR::IntConstOpnd::New(2,TyUint8,this->m_func,false);
      InsertTest(&pIVar12->super_Opnd,&pIVar15->super_Opnd,instr);
      InsertBranch(BrNeq_A,false,target_00,instr);
      target_01 = IR::LabelInstr::New(Label,this->m_func,false);
      OVar5 = IR::Opnd::GetKind(&pRVar9->super_Opnd);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005a8e93;
        *puVar8 = 0;
      }
      pIVar12 = IR::IndirOpnd::New(pRVar9,0x18,TyUint32,this->m_func,false);
      pLVar17 = (Lowerer *)0x2;
      pIVar15 = IR::IntConstOpnd::New(2,TyUint32,this->m_func,false);
      InsertCompareBranch(pLVar17,&pIVar12->super_Opnd,&pIVar15->super_Opnd,BrLt_A,false,target_01,
                          instr,false);
      pRVar13 = IR::RegOpnd::New(TyInt64,this->m_func);
      OVar5 = IR::Opnd::GetKind(&pRVar9->super_Opnd);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005a8e93;
        *puVar8 = 0;
      }
      pIVar12 = IR::IndirOpnd::New(pRVar9,0x10,TyUint64,this->m_func,false);
      InsertMove(&pRVar13->super_Opnd,&pIVar12->super_Opnd,instr,true);
      target_02 = IR::LabelInstr::New(Label,this->m_func,false);
      InsertTest(&pRVar13->super_Opnd,&pRVar13->super_Opnd,instr);
      InsertBranch(BrNeq_A,false,target_02,instr);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pRVar9->super_Opnd);
      src1Opnd = IR::HelperCallOpnd::New(HelperString_GetSz,this->m_func);
      pIVar16 = IR::Instr::New(Call,&pRVar13->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar16);
      LowererMD::LowerCall(&this->m_lowererMD,pIVar16,0);
      IR::Instr::InsertBefore(instr,&target_02->super_Instr);
      dst_00 = IR::RegOpnd::New(TyUint32,this->m_func);
      pIVar12 = IR::IndirOpnd::New(pRVar13,0,TyUint32,this->m_func,false);
      InsertMove(&dst_00->super_Opnd,&pIVar12->super_Opnd,instr,true);
      pIVar12 = IR::IndirOpnd::New((RegOpnd *)pLVar14,0x18,TyUint32,this->m_func,false);
      InsertCompareBranch(pLVar14,&pIVar12->super_Opnd,&dst_00->super_Opnd,BrEq_A,false,target_00,
                          instr,false);
      IR::Instr::InsertBefore(instr,&target_01->super_Instr);
      OVar5 = IR::Opnd::GetKind((Opnd *)pLVar11);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005a8e93;
        *puVar8 = 0;
      }
      pIVar12 = IR::IndirOpnd::New((RegOpnd *)pLVar11,0x30,TyVar,this->m_func,false);
      pAVar10 = IR::AddrOpnd::NewNull(this->m_func);
      InsertMove(&pIVar12->super_Opnd,&pAVar10->super_Opnd,instr,true);
      OVar5 = IR::Opnd::GetKind((Opnd *)pLVar11);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) {
LAB_005a8e93:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      pIVar12 = IR::IndirOpnd::New((RegOpnd *)pLVar11,0x38,TyUint32,this->m_func,false);
      pIVar15 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,false);
      InsertMove(&pIVar12->super_Opnd,&pIVar15->super_Opnd,instr,true);
      if (dst != (Opnd *)0x0) {
        iVar6 = (**instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo)();
        pAVar10 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar6),AddrOpndKindDynamicVar,
                                    instr->m_func,true,(Var)0x0);
        InsertMove(dst,&pAVar10->super_Opnd,instr,true);
      }
      InsertBranch(Br,false,target,instr);
      IR::Instr::InsertBefore(instr,&target_00->super_Instr);
    }
    pIVar16 = IR::Instr::New(CALL,instr->m_func);
    if (dst != (Opnd *)0x0) {
      IR::Instr::SetDst(pIVar16,dst);
    }
    IR::Instr::InsertBefore(instr,pIVar16);
    if (((instr->field_0x38 & 0x10) != 0) &&
       (BVar7 = IR::Instr::GetBailOutKind(instr),
       (BVar7 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls)) {
      bailoutInfo = IR::Instr::GetBailOutInfo(instr);
      BVar7 = IR::Instr::GetBailOutKind(instr);
      pIVar16 = AddBailoutToHelperCallInstr(this,pIVar16,bailoutInfo,BVar7,instr);
    }
    this_00 = &this->m_lowererMD;
    LowererMD::LoadHelperArgument(this_00,pIVar16,&pRVar9->super_Opnd);
    LowererMD::LoadHelperArgument(this_00,pIVar16,(Opnd *)pLVar11);
    LoadScriptContext(this,pIVar16);
    argsOpnd[1] = (Opnd *)0x0;
    if (dst == (Opnd *)0x0) {
      helperMethod = HelperRegExp_ExecResultNotUsed;
    }
    else {
      helperMethod = HelperRegExp_ExecResultUsed;
      if ((instr->field_0x36 & 8) != 0) {
        pRVar9 = IR::RegOpnd::New(TyVar,this->m_func);
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)(argsOpnd + 1),&pRVar9->super_Opnd,this->m_func,true);
        valueType = dst->m_valueType;
        IR::Opnd::SetValueType(&pRVar9->super_Opnd,(ValueType)valueType);
        GenerateMarkTempAlloc(this,pRVar9,Js::JavascriptArray::StackAllocationSize,pIVar16);
        helperMethod = HelperRegExp_ExecResultUsedAndMayBeTemp;
        LowererMD::LoadHelperArgument(this_00,pIVar16,&pRVar9->super_Opnd);
      }
    }
    LowererMD::ChangeToHelperCall
              (this_00,pIVar16,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,
               false);
    IR::Instr::InsertAfter(instr,&target->super_Instr);
    IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
    pLVar11 = (Lowerer *)0x9;
    InsertBranch(Br,true,target,&labelHelper->super_Instr);
    RelocateCallDirectToHelperPath(pLVar11,argoutInlineSpecialized,labelHelper);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)(argsOpnd + 1));
  }
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineRegExpExec(IR::Instr * instr)
{
    // a.exec(b)
    // We want to emit the fast path when 'a' is a regex and 'b' is a string

    Assert(instr->m_opcode == Js::OpCode::CallDirect);
    IR::Opnd * callDst = instr->GetDst();

    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = instr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2];
    if (!instr->FetchOperands(argsOpnd, 2))
    {
        return;
    }

    IR::Opnd *opndString = argsOpnd[1];
    if(!opndString->GetValueType().IsLikelyString() || argsOpnd[0]->IsTaggedInt())
    {
        return;
    }

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    if(!opndString->GetValueType().IsString())
    {
        opndString = GetRegOpnd(opndString, instr, m_func, TyVar);
        this->GenerateStringTest(opndString->AsRegOpnd(), instr, labelHelper);
    }

    IR::Opnd *opndRegex = argsOpnd[0];
    if(!opndRegex->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(opndRegex, instr, labelHelper);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp);

    // cmp  [regex], vtableAddress
    // jne  $labelHelper
    opndRegex = GetRegOpnd(opndRegex, instr, m_func, TyVar);
    InsertCompareBranch(
        IR::IndirOpnd::New(opndRegex->AsRegOpnd(), 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        labelHelper,
        instr);

    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    if (!PHASE_OFF(Js::ExecBOIFastPathPhase, m_func))
    {
        // Load pattern from regex operand
        IR::RegOpnd *opndPattern = IR::RegOpnd::New(TyMachPtr, m_func);
        Lowerer::InsertMove(
            opndPattern,
            IR::IndirOpnd::New(opndRegex->AsRegOpnd(), Js::JavascriptRegExp::GetOffsetOfPattern(), TyMachPtr, m_func),
            instr);

        // Load program from pattern
        IR::RegOpnd *opndProgram = IR::RegOpnd::New(TyMachPtr, m_func);
        Lowerer::InsertMove(
            opndProgram,
            IR::IndirOpnd::New(opndPattern, offsetof(UnifiedRegex::RegexPattern, rep) + offsetof(UnifiedRegex::RegexPattern::UnifiedRep, program), TyMachPtr, m_func),
            instr);

        IR::LabelInstr *labelFastHelper = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        // We want the program's tag to be BOILiteral2Tag
        InsertCompareBranch(
            IR::IndirOpnd::New(opndProgram, (int32)UnifiedRegex::Program::GetOffsetOfTag(), TyUint8, m_func),
            IR::IntConstOpnd::New((IntConstType)UnifiedRegex::Program::GetBOILiteral2Tag(), TyUint8, m_func),
            Js::OpCode::BrNeq_A,
            labelFastHelper,
            instr);

        // Test the program's flags for "global"
        InsertTestBranch(
            IR::IndirOpnd::New(opndProgram, offsetof(UnifiedRegex::Program, flags), TyUint8, m_func),
            IR::IntConstOpnd::New(UnifiedRegex::GlobalRegexFlag, TyUint8, m_func),
            Js::OpCode::BrNeq_A,
            labelFastHelper,
            instr);

        IR::LabelInstr *labelNoMatch = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        // If string length < 2...
        InsertCompareBranch(
            IR::IndirOpnd::New(opndString->AsRegOpnd(), offsetof(Js::JavascriptString, m_charLength), TyUint32, m_func),
            IR::IntConstOpnd::New(2, TyUint32, m_func),
            Js::OpCode::BrLt_A,
            labelNoMatch,
            instr);

        // ...or the DWORD doesn't match the pattern...
        IR::RegOpnd *opndBuffer = IR::RegOpnd::New(TyMachReg, m_func);
        Lowerer::InsertMove(
            opndBuffer,
            IR::IndirOpnd::New(opndString->AsRegOpnd(), offsetof(Js::JavascriptString, m_pszValue), TyMachPtr, m_func),
            instr);

        IR::LabelInstr *labelGotString = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        InsertTestBranch(opndBuffer, opndBuffer, Js::OpCode::BrNeq_A, labelGotString, instr);

        m_lowererMD.LoadHelperArgument(instr, opndString);
        IR::Instr *instrCall = IR::Instr::New(Js::OpCode::Call, opndBuffer, IR::HelperCallOpnd::New(IR::HelperString_GetSz, m_func), m_func);
        instr->InsertBefore(instrCall);
        m_lowererMD.LowerCall(instrCall, 0);

        instr->InsertBefore(labelGotString);

        IR::RegOpnd *opndBufferDWORD = IR::RegOpnd::New(TyUint32, m_func);
        Lowerer::InsertMove(
            opndBufferDWORD,
            IR::IndirOpnd::New(opndBuffer, 0, TyUint32, m_func),
            instr);

        InsertCompareBranch(
            IR::IndirOpnd::New(opndProgram, (int32)(UnifiedRegex::Program::GetOffsetOfRep() + UnifiedRegex::Program::GetOffsetOfBOILiteral2Literal()), TyUint32, m_func),
            opndBufferDWORD,
            Js::OpCode::BrEq_A,
            labelFastHelper,
            instr);

        // ...then set the last index to 0...
        instr->InsertBefore(labelNoMatch);

        Lowerer::InsertMove(
            IR::IndirOpnd::New(opndRegex->AsRegOpnd(), Js::JavascriptRegExp::GetOffsetOfLastIndexVar(), TyVar, m_func),
            IR::AddrOpnd::NewNull(m_func),
            instr);

        Lowerer::InsertMove(
            IR::IndirOpnd::New(opndRegex->AsRegOpnd(), Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag(), TyUint32, m_func),
            IR::IntConstOpnd::New(0, TyUint32, m_func),
            instr);

        // ...and set the dst to null...
        if (callDst)
        {
            Lowerer::InsertMove(
                callDst,
                LoadLibraryValueOpnd(instr, LibraryValue::ValueNull),
                instr);
        }

        // ...and we're done.
        this->InsertBranch(Js::OpCode::Br, doneLabel, instr);

        instr->InsertBefore(labelFastHelper);
    }

    IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, instr->m_func);
    if (callDst)
    {
        helperCallInstr->SetDst(callDst);
    }
    instr->InsertBefore(helperCallInstr);
    if (instr->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind()))
    {
        helperCallInstr = AddBailoutToHelperCallInstr(helperCallInstr, instr->GetBailOutInfo(), instr->GetBailOutKind(), instr);
    }
    // [stackAllocationPointer, ]scriptcontext, regexp, string (to be pushed in reverse order)

    //string, regexp
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, opndString);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, opndRegex);

    // script context
    LoadScriptContext(helperCallInstr);

    IR::JnHelperMethod helperMethod;
    IR::AutoReuseOpnd autoReuseStackAllocationOpnd;
    if (callDst)
    {
        if (instr->dstIsTempObject)
        {
            helperMethod = IR::JnHelperMethod::HelperRegExp_ExecResultUsedAndMayBeTemp;

            // Allocate some space on the stack for the result array
            IR::RegOpnd *const stackAllocationOpnd = IR::RegOpnd::New(TyVar, m_func);
            autoReuseStackAllocationOpnd.Initialize(stackAllocationOpnd, m_func);
            stackAllocationOpnd->SetValueType(callDst->GetValueType());
            GenerateMarkTempAlloc(stackAllocationOpnd, Js::JavascriptArray::StackAllocationSize, helperCallInstr);
            m_lowererMD.LoadHelperArgument(helperCallInstr, stackAllocationOpnd);
        }
        else
        {
            helperMethod = IR::JnHelperMethod::HelperRegExp_ExecResultUsed;
        }
    }
    else
    {
        helperMethod = IR::JnHelperMethod::HelperRegExp_ExecResultNotUsed;
    }

    m_lowererMD.ChangeToHelperCall(helperCallInstr, helperMethod);

    instr->InsertAfter(doneLabel);
    instr->InsertBefore(labelHelper);
    InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
}